

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O0

void __thiscall
netlist::NetlistVariableDeclaration::~NetlistVariableDeclaration(NetlistVariableDeclaration *this)

{
  NetlistVariableDeclaration *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~NetlistVariableDeclaration(in_RDI);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

NetlistVariableDeclaration(const ast::Symbol& symbol) :
        NetlistNode(NodeKind::VariableDeclaration, symbol) {}